

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * regex_escape(string *s)

{
  int iVar1;
  string *in_RDI;
  flag_type unaff_retaddr;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  match_flag_type in_stack_00000014;
  char *in_stack_00000018;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_00000020;
  
  if (regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_
                               );
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,unaff_retaddr);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (s,in_stack_00000020,in_stack_00000018,in_stack_00000014);
  return in_RDI;
}

Assistant:

std::string regex_escape(const std::string & s) {
    static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
    return std::regex_replace(s, special_chars, "\\$0");
}